

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::UnaryExpr<const_CLI::Option_&>::streamReconstructedExpression
          (UnaryExpr<const_CLI::Option_&> *this,ostream *os)

{
  char *local_38;
  long local_30;
  char local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,Detail::unprintableString_abi_cxx11_,
             DAT_0023c770 + Detail::unprintableString_abi_cxx11_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }